

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_stage10_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar3 [16];
  __m128i alVar4;
  __m128i alVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  __m128i alVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar10 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar30 [16];
  undefined1 auVar35 [16];
  undefined1 auVar40 [16];
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  undefined1 auVar26 [16];
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  undefined1 auVar41 [16];
  undefined1 auVar12 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  undefined1 auVar32 [16];
  undefined1 auVar37 [16];
  undefined1 auVar42 [16];
  
  alVar4 = *x;
  alVar5 = x[1];
  alVar1 = x[2];
  alVar2 = x[3];
  alVar71 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x1f]);
  *x = alVar71;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x1f]);
  x[0x1f] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar5,(undefined1  [16])x[0x1e]);
  x[1] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar5,(undefined1  [16])x[0x1e]);
  x[0x1e] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar1,(undefined1  [16])x[0x1d]);
  x[2] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar1,(undefined1  [16])x[0x1d]);
  x[0x1d] = alVar4;
  alVar4 = (__m128i)paddsw((undefined1  [16])alVar2,(undefined1  [16])x[0x1c]);
  x[3] = alVar4;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar2,(undefined1  [16])x[0x1c]);
  x[0x1c] = alVar4;
  alVar4 = x[4];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x1b]);
  x[4] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x1b]);
  x[0x1b] = alVar4;
  alVar4 = x[5];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x1a]);
  x[5] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x1a]);
  x[0x1a] = alVar4;
  alVar4 = x[6];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x19]);
  x[6] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x19]);
  x[0x19] = alVar4;
  alVar4 = x[7];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x18]);
  x[7] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x18]);
  x[0x18] = alVar4;
  alVar4 = x[8];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x17]);
  x[8] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x17]);
  x[0x17] = alVar4;
  alVar4 = x[9];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x16]);
  x[9] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x16]);
  x[0x16] = alVar4;
  alVar4 = x[10];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x15]);
  x[10] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x15]);
  x[0x15] = alVar4;
  alVar4 = x[0xb];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x14]);
  x[0xb] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x14]);
  x[0x14] = alVar4;
  alVar4 = x[0xc];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x13]);
  x[0xc] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x13]);
  x[0x13] = alVar4;
  alVar4 = x[0xd];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x12]);
  x[0xd] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x12]);
  x[0x12] = alVar4;
  alVar4 = x[0xe];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x11]);
  x[0xe] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x11]);
  x[0x11] = alVar4;
  alVar4 = x[0xf];
  alVar5 = (__m128i)paddsw((undefined1  [16])alVar4,(undefined1  [16])x[0x10]);
  x[0xf] = alVar5;
  alVar4 = (__m128i)psubsw((undefined1  [16])alVar4,(undefined1  [16])x[0x10]);
  x[0x10] = alVar4;
  alVar4 = x[0x28];
  auVar6._0_12_ = alVar4._0_12_;
  auVar6._12_2_ = alVar4[0]._6_2_;
  auVar6._14_2_ = *(undefined2 *)((long)x[0x37] + 6);
  auVar72._12_4_ = auVar6._12_4_;
  auVar72._0_10_ = alVar4._0_10_;
  auVar72._10_2_ = *(undefined2 *)((long)x[0x37] + 4);
  auVar62._10_6_ = auVar72._10_6_;
  auVar62._0_8_ = alVar4[0];
  auVar62._8_2_ = alVar4[0]._4_2_;
  auVar45._8_8_ = auVar62._8_8_;
  auVar45._6_2_ = *(undefined2 *)((long)x[0x37] + 2);
  auVar45._4_2_ = alVar4[0]._2_2_;
  auVar45._0_2_ = (undefined2)alVar4[0];
  auVar45._2_2_ = (short)x[0x37][0];
  auVar44._2_2_ = (short)x[0x37][1];
  auVar44._0_2_ = (short)alVar4[1];
  auVar44._4_2_ = alVar4[1]._2_2_;
  auVar44._6_2_ = *(undefined2 *)((long)x[0x37] + 10);
  auVar44._8_2_ = alVar4[1]._4_2_;
  auVar44._10_2_ = *(undefined2 *)((long)x[0x37] + 0xc);
  auVar44._12_2_ = alVar4[1]._6_2_;
  auVar44._14_2_ = *(undefined2 *)((long)x[0x37] + 0xe);
  auVar3._8_4_ = 0xb50f4b0;
  auVar3._0_8_ = 0xb50f4b00b50f4b0;
  auVar3._12_4_ = 0xb50f4b0;
  auVar62 = pmaddwd(auVar45,auVar3);
  auVar72 = pmaddwd(auVar44,auVar3);
  auVar60._8_4_ = 0xb500b50;
  auVar60._0_8_ = 0xb500b500b500b50;
  auVar60._12_4_ = 0xb500b50;
  auVar7 = pmaddwd(auVar45,auVar60);
  auVar45 = pmaddwd(auVar44,auVar60);
  auVar63._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar63._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar63._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar63._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  auVar73._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar73._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar73._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar73._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar63,auVar73);
  auVar8._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar8._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar8._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar8._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar46._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar46._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar46._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar46._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar8,auVar46);
  x[0x28] = alVar5;
  x[0x37] = alVar4;
  alVar4 = x[0x29];
  auVar12._0_12_ = alVar4._0_12_;
  auVar12._12_2_ = alVar4[0]._6_2_;
  auVar12._14_2_ = *(undefined2 *)((long)x[0x36] + 6);
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._0_10_ = alVar4._0_10_;
  auVar11._10_2_ = *(undefined2 *)((long)x[0x36] + 4);
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._0_8_ = alVar4[0];
  auVar10._8_2_ = alVar4[0]._4_2_;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._6_2_ = *(undefined2 *)((long)x[0x36] + 2);
  auVar9._4_2_ = alVar4[0]._2_2_;
  auVar9._0_2_ = (undefined2)alVar4[0];
  auVar9._2_2_ = (short)x[0x36][0];
  auVar47._2_2_ = (short)x[0x36][1];
  auVar47._0_2_ = (short)alVar4[1];
  auVar47._4_2_ = alVar4[1]._2_2_;
  auVar47._6_2_ = *(undefined2 *)((long)x[0x36] + 10);
  auVar47._8_2_ = alVar4[1]._4_2_;
  auVar47._10_2_ = *(undefined2 *)((long)x[0x36] + 0xc);
  auVar47._12_2_ = alVar4[1]._6_2_;
  auVar47._14_2_ = *(undefined2 *)((long)x[0x36] + 0xe);
  auVar62 = pmaddwd(auVar9,auVar3);
  auVar72 = pmaddwd(auVar47,auVar3);
  auVar7 = pmaddwd(auVar9,auVar60);
  auVar45 = pmaddwd(auVar47,auVar60);
  auVar64._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar64._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar64._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar64._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  auVar74._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar74._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar74._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar74._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar64,auVar74);
  auVar13._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar13._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar13._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar13._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar48._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar48._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar48._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar48._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar13,auVar48);
  x[0x29] = alVar5;
  x[0x36] = alVar4;
  alVar4 = x[0x2a];
  auVar17._0_12_ = alVar4._0_12_;
  auVar17._12_2_ = alVar4[0]._6_2_;
  auVar17._14_2_ = *(undefined2 *)((long)x[0x35] + 6);
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_10_ = alVar4._0_10_;
  auVar16._10_2_ = *(undefined2 *)((long)x[0x35] + 4);
  auVar15._10_6_ = auVar16._10_6_;
  auVar15._0_8_ = alVar4[0];
  auVar15._8_2_ = alVar4[0]._4_2_;
  auVar14._8_8_ = auVar15._8_8_;
  auVar14._6_2_ = *(undefined2 *)((long)x[0x35] + 2);
  auVar14._4_2_ = alVar4[0]._2_2_;
  auVar14._0_2_ = (undefined2)alVar4[0];
  auVar14._2_2_ = (short)x[0x35][0];
  auVar49._2_2_ = (short)x[0x35][1];
  auVar49._0_2_ = (short)alVar4[1];
  auVar49._4_2_ = alVar4[1]._2_2_;
  auVar49._6_2_ = *(undefined2 *)((long)x[0x35] + 10);
  auVar49._8_2_ = alVar4[1]._4_2_;
  auVar49._10_2_ = *(undefined2 *)((long)x[0x35] + 0xc);
  auVar49._12_2_ = alVar4[1]._6_2_;
  auVar49._14_2_ = *(undefined2 *)((long)x[0x35] + 0xe);
  auVar62 = pmaddwd(auVar14,auVar3);
  auVar72 = pmaddwd(auVar49,auVar3);
  auVar7 = pmaddwd(auVar14,auVar60);
  auVar45 = pmaddwd(auVar49,auVar60);
  auVar65._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar65._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar65._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar65._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  auVar75._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar75._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar75._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar75._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar65,auVar75);
  auVar18._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar18._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar18._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar18._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar50._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar50._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar50._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar50._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar18,auVar50);
  x[0x2a] = alVar5;
  x[0x35] = alVar4;
  alVar4 = x[0x2b];
  auVar22._0_12_ = alVar4._0_12_;
  auVar22._12_2_ = alVar4[0]._6_2_;
  auVar22._14_2_ = *(undefined2 *)((long)x[0x34] + 6);
  auVar21._12_4_ = auVar22._12_4_;
  auVar21._0_10_ = alVar4._0_10_;
  auVar21._10_2_ = *(undefined2 *)((long)x[0x34] + 4);
  auVar20._10_6_ = auVar21._10_6_;
  auVar20._0_8_ = alVar4[0];
  auVar20._8_2_ = alVar4[0]._4_2_;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._6_2_ = *(undefined2 *)((long)x[0x34] + 2);
  auVar19._4_2_ = alVar4[0]._2_2_;
  auVar19._0_2_ = (undefined2)alVar4[0];
  auVar19._2_2_ = (short)x[0x34][0];
  auVar51._2_2_ = (short)x[0x34][1];
  auVar51._0_2_ = (short)alVar4[1];
  auVar51._4_2_ = alVar4[1]._2_2_;
  auVar51._6_2_ = *(undefined2 *)((long)x[0x34] + 10);
  auVar51._8_2_ = alVar4[1]._4_2_;
  auVar51._10_2_ = *(undefined2 *)((long)x[0x34] + 0xc);
  auVar51._12_2_ = alVar4[1]._6_2_;
  auVar51._14_2_ = *(undefined2 *)((long)x[0x34] + 0xe);
  auVar62 = pmaddwd(auVar19,auVar3);
  auVar72 = pmaddwd(auVar51,auVar3);
  auVar7 = pmaddwd(auVar19,auVar60);
  auVar45 = pmaddwd(auVar51,auVar60);
  auVar66._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar66._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar66._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar66._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  auVar76._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar76._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar76._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar76._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar66,auVar76);
  auVar23._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar23._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar23._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar23._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar52._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar52._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar52._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar52._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar23,auVar52);
  x[0x2b] = alVar5;
  x[0x34] = alVar4;
  alVar4 = x[0x2c];
  auVar27._0_12_ = alVar4._0_12_;
  auVar27._12_2_ = alVar4[0]._6_2_;
  auVar27._14_2_ = *(undefined2 *)((long)x[0x33] + 6);
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = alVar4._0_10_;
  auVar26._10_2_ = *(undefined2 *)((long)x[0x33] + 4);
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = alVar4[0];
  auVar25._8_2_ = alVar4[0]._4_2_;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._6_2_ = *(undefined2 *)((long)x[0x33] + 2);
  auVar24._4_2_ = alVar4[0]._2_2_;
  auVar24._0_2_ = (undefined2)alVar4[0];
  auVar24._2_2_ = (short)x[0x33][0];
  auVar53._2_2_ = (short)x[0x33][1];
  auVar53._0_2_ = (short)alVar4[1];
  auVar53._4_2_ = alVar4[1]._2_2_;
  auVar53._6_2_ = *(undefined2 *)((long)x[0x33] + 10);
  auVar53._8_2_ = alVar4[1]._4_2_;
  auVar53._10_2_ = *(undefined2 *)((long)x[0x33] + 0xc);
  auVar53._12_2_ = alVar4[1]._6_2_;
  auVar53._14_2_ = *(undefined2 *)((long)x[0x33] + 0xe);
  auVar62 = pmaddwd(auVar24,auVar3);
  auVar72 = pmaddwd(auVar53,auVar3);
  auVar7 = pmaddwd(auVar24,auVar60);
  auVar45 = pmaddwd(auVar53,auVar60);
  auVar67._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar67._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar67._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar67._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  auVar77._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar77._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar77._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar77._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar67,auVar77);
  auVar28._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar28._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar28._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar28._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar54._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar54._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar54._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar54._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar28,auVar54);
  x[0x2c] = alVar5;
  x[0x33] = alVar4;
  alVar4 = x[0x2d];
  auVar32._0_12_ = alVar4._0_12_;
  auVar32._12_2_ = alVar4[0]._6_2_;
  auVar32._14_2_ = *(undefined2 *)((long)x[0x32] + 6);
  auVar31._12_4_ = auVar32._12_4_;
  auVar31._0_10_ = alVar4._0_10_;
  auVar31._10_2_ = *(undefined2 *)((long)x[0x32] + 4);
  auVar30._10_6_ = auVar31._10_6_;
  auVar30._0_8_ = alVar4[0];
  auVar30._8_2_ = alVar4[0]._4_2_;
  auVar29._8_8_ = auVar30._8_8_;
  auVar29._6_2_ = *(undefined2 *)((long)x[0x32] + 2);
  auVar29._4_2_ = alVar4[0]._2_2_;
  auVar29._0_2_ = (undefined2)alVar4[0];
  auVar29._2_2_ = (short)x[0x32][0];
  auVar55._2_2_ = (short)x[0x32][1];
  auVar55._0_2_ = (short)alVar4[1];
  auVar55._4_2_ = alVar4[1]._2_2_;
  auVar55._6_2_ = *(undefined2 *)((long)x[0x32] + 10);
  auVar55._8_2_ = alVar4[1]._4_2_;
  auVar55._10_2_ = *(undefined2 *)((long)x[0x32] + 0xc);
  auVar55._12_2_ = alVar4[1]._6_2_;
  auVar55._14_2_ = *(undefined2 *)((long)x[0x32] + 0xe);
  auVar62 = pmaddwd(auVar29,auVar3);
  auVar72 = pmaddwd(auVar55,auVar3);
  auVar7 = pmaddwd(auVar29,auVar60);
  auVar45 = pmaddwd(auVar55,auVar60);
  auVar68._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar68._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar68._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar68._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  auVar78._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar78._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar78._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar78._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar68,auVar78);
  auVar33._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar33._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar33._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar33._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar56._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar56._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar56._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar56._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar33,auVar56);
  x[0x2d] = alVar5;
  x[0x32] = alVar4;
  alVar4 = x[0x2e];
  auVar37._0_12_ = alVar4._0_12_;
  auVar37._12_2_ = alVar4[0]._6_2_;
  auVar37._14_2_ = *(undefined2 *)((long)x[0x31] + 6);
  auVar36._12_4_ = auVar37._12_4_;
  auVar36._0_10_ = alVar4._0_10_;
  auVar36._10_2_ = *(undefined2 *)((long)x[0x31] + 4);
  auVar35._10_6_ = auVar36._10_6_;
  auVar35._0_8_ = alVar4[0];
  auVar35._8_2_ = alVar4[0]._4_2_;
  auVar34._8_8_ = auVar35._8_8_;
  auVar34._6_2_ = *(undefined2 *)((long)x[0x31] + 2);
  auVar34._4_2_ = alVar4[0]._2_2_;
  auVar34._0_2_ = (undefined2)alVar4[0];
  auVar34._2_2_ = (short)x[0x31][0];
  auVar57._2_2_ = (short)x[0x31][1];
  auVar57._0_2_ = (short)alVar4[1];
  auVar57._4_2_ = alVar4[1]._2_2_;
  auVar57._6_2_ = *(undefined2 *)((long)x[0x31] + 10);
  auVar57._8_2_ = alVar4[1]._4_2_;
  auVar57._10_2_ = *(undefined2 *)((long)x[0x31] + 0xc);
  auVar57._12_2_ = alVar4[1]._6_2_;
  auVar57._14_2_ = *(undefined2 *)((long)x[0x31] + 0xe);
  auVar62 = pmaddwd(auVar34,auVar3);
  auVar72 = pmaddwd(auVar57,auVar3);
  auVar7 = pmaddwd(auVar34,auVar60);
  auVar45 = pmaddwd(auVar57,auVar60);
  auVar69._0_4_ = auVar62._0_4_ + in_XMM0_Da >> 0xc;
  auVar69._4_4_ = auVar62._4_4_ + in_XMM0_Db >> 0xc;
  auVar69._8_4_ = auVar62._8_4_ + in_XMM0_Dc >> 0xc;
  auVar69._12_4_ = auVar62._12_4_ + in_XMM0_Dd >> 0xc;
  auVar79._0_4_ = auVar72._0_4_ + in_XMM0_Da >> 0xc;
  auVar79._4_4_ = auVar72._4_4_ + in_XMM0_Db >> 0xc;
  auVar79._8_4_ = auVar72._8_4_ + in_XMM0_Dc >> 0xc;
  auVar79._12_4_ = auVar72._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar69,auVar79);
  auVar38._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar38._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar38._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar38._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar58._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar58._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar58._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar58._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar38,auVar58);
  x[0x2e] = alVar5;
  x[0x31] = alVar4;
  alVar4 = x[0x2f];
  auVar42._0_12_ = alVar4._0_12_;
  auVar42._12_2_ = alVar4[0]._6_2_;
  auVar42._14_2_ = *(undefined2 *)((long)x[0x30] + 6);
  auVar41._12_4_ = auVar42._12_4_;
  auVar41._0_10_ = alVar4._0_10_;
  auVar41._10_2_ = *(undefined2 *)((long)x[0x30] + 4);
  auVar40._10_6_ = auVar41._10_6_;
  auVar40._0_8_ = alVar4[0];
  auVar40._8_2_ = alVar4[0]._4_2_;
  auVar39._8_8_ = auVar40._8_8_;
  auVar39._6_2_ = *(undefined2 *)((long)x[0x30] + 2);
  auVar39._4_2_ = alVar4[0]._2_2_;
  auVar39._0_2_ = (undefined2)alVar4[0];
  auVar39._2_2_ = (short)x[0x30][0];
  auVar59._2_2_ = (short)x[0x30][1];
  auVar59._0_2_ = (short)alVar4[1];
  auVar59._4_2_ = alVar4[1]._2_2_;
  auVar59._6_2_ = *(undefined2 *)((long)x[0x30] + 10);
  auVar59._8_2_ = alVar4[1]._4_2_;
  auVar59._10_2_ = *(undefined2 *)((long)x[0x30] + 0xc);
  auVar59._12_2_ = alVar4[1]._6_2_;
  auVar59._14_2_ = *(undefined2 *)((long)x[0x30] + 0xe);
  auVar7 = pmaddwd(auVar39,auVar3);
  auVar3 = pmaddwd(auVar3,auVar59);
  auVar45 = pmaddwd(auVar39,auVar60);
  auVar60 = pmaddwd(auVar59,auVar60);
  auVar70._0_4_ = auVar7._0_4_ + in_XMM0_Da >> 0xc;
  auVar70._4_4_ = auVar7._4_4_ + in_XMM0_Db >> 0xc;
  auVar70._8_4_ = auVar7._8_4_ + in_XMM0_Dc >> 0xc;
  auVar70._12_4_ = auVar7._12_4_ + in_XMM0_Dd >> 0xc;
  auVar7._0_4_ = auVar3._0_4_ + in_XMM0_Da >> 0xc;
  auVar7._4_4_ = auVar3._4_4_ + in_XMM0_Db >> 0xc;
  auVar7._8_4_ = auVar3._8_4_ + in_XMM0_Dc >> 0xc;
  auVar7._12_4_ = auVar3._12_4_ + in_XMM0_Dd >> 0xc;
  alVar5 = (__m128i)packssdw(auVar70,auVar7);
  auVar43._0_4_ = auVar45._0_4_ + in_XMM0_Da >> 0xc;
  auVar43._4_4_ = auVar45._4_4_ + in_XMM0_Db >> 0xc;
  auVar43._8_4_ = auVar45._8_4_ + in_XMM0_Dc >> 0xc;
  auVar43._12_4_ = auVar45._12_4_ + in_XMM0_Dd >> 0xc;
  auVar61._0_4_ = auVar60._0_4_ + in_XMM0_Da >> 0xc;
  auVar61._4_4_ = auVar60._4_4_ + in_XMM0_Db >> 0xc;
  auVar61._8_4_ = auVar60._8_4_ + in_XMM0_Dc >> 0xc;
  auVar61._12_4_ = auVar60._12_4_ + in_XMM0_Dd >> 0xc;
  alVar4 = (__m128i)packssdw(auVar43,auVar61);
  x[0x2f] = alVar5;
  x[0x30] = alVar4;
  return;
}

Assistant:

static inline void idct64_stage10_sse2(__m128i *x, const int32_t *cospi,
                                       const __m128i __rounding,
                                       int8_t cos_bit) {
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  btf_16_adds_subs_sse2(x[0], x[31]);
  btf_16_adds_subs_sse2(x[1], x[30]);
  btf_16_adds_subs_sse2(x[2], x[29]);
  btf_16_adds_subs_sse2(x[3], x[28]);
  btf_16_adds_subs_sse2(x[4], x[27]);
  btf_16_adds_subs_sse2(x[5], x[26]);
  btf_16_adds_subs_sse2(x[6], x[25]);
  btf_16_adds_subs_sse2(x[7], x[24]);
  btf_16_adds_subs_sse2(x[8], x[23]);
  btf_16_adds_subs_sse2(x[9], x[22]);
  btf_16_adds_subs_sse2(x[10], x[21]);
  btf_16_adds_subs_sse2(x[11], x[20]);
  btf_16_adds_subs_sse2(x[12], x[19]);
  btf_16_adds_subs_sse2(x[13], x[18]);
  btf_16_adds_subs_sse2(x[14], x[17]);
  btf_16_adds_subs_sse2(x[15], x[16]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[40], x[55], x[40], x[55]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[42], x[53], x[42], x[53]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[43], x[52], x[43], x[52]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[44], x[51], x[44], x[51]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[45], x[50], x[45], x[50]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[46], x[49], x[46], x[49]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[47], x[48], x[47], x[48]);
}